

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

size_type __thiscall
google::protobuf::stringpiece_internal::StringPiece::find_last_of
          (StringPiece *this,StringPiece s,size_type pos)

{
  char cVar1;
  long lVar2;
  size_type i;
  size_type sVar3;
  size_type length;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  char *data;
  bool lookup [256];
  char acStack_138 [264];
  
  sVar6 = s.length_;
  sVar5 = this->length_;
  if (sVar6 == 0 || sVar5 == 0) {
LAB_0037a214:
    sVar3 = 0xffffffffffffffff;
  }
  else if (sVar6 == 1) {
    sVar3 = sVar5 - 1;
    if (pos <= sVar5 - 1) {
      sVar3 = pos;
    }
    cVar1 = this->ptr_[sVar3];
    while (cVar1 != *s.ptr_) {
      if (sVar3 == 0) goto LAB_0037a214;
      cVar1 = this->ptr_[sVar3 - 1];
      sVar3 = sVar3 - 1;
    }
  }
  else {
    sVar3 = 0;
    memset(acStack_138,0,0x100);
    do {
      acStack_138[(byte)s.ptr_[sVar3]] = '\x01';
      sVar3 = sVar3 + 1;
    } while (sVar6 != sVar3);
    uVar4 = sVar5 - 1;
    if (pos <= sVar5 - 1) {
      uVar4 = pos;
    }
    sVar5 = uVar4 + 1;
    do {
      lVar2 = sVar5 - 1;
      sVar6 = sVar5 - 1;
      if (sVar5 == 1) break;
      sVar5 = sVar6;
    } while (acStack_138[(byte)this->ptr_[lVar2]] == '\0');
    sVar3 = 0xffffffffffffffff;
    if (acStack_138[(byte)this->ptr_[lVar2]] != '\0') {
      sVar3 = sVar6;
    }
  }
  return sVar3;
}

Assistant:

StringPiece::size_type StringPiece::find_last_of(StringPiece s,
                                                 size_type pos) const {
  if (empty() || s.empty()) return npos;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (size_type i = std::min(pos, length_ - 1);; --i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
    if (i == 0) break;
  }
  return npos;
}